

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  Mat *in_RAX;
  Option *opt_00;
  undefined1 (*pauVar3) [32];
  int iVar4;
  uint uVar5;
  Mat *pMVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  undefined1 (*pauVar10) [32];
  float *pfVar11;
  undefined1 (*pauVar12) [32];
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  
  if (0xb < (uint)op_type) goto switchD_003d291d_default;
  opt_00 = (Option *)
           ((long)&switchD_003d291d::switchdataD_0059da6c +
           (long)(int)(&switchD_003d291d::switchdataD_0059da6c)[(uint)op_type]);
  in_RAX = a;
  switch(op_type) {
  case 0:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pfVar9 = (float *)(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pfVar11 = (float *)(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [32])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 8) {
          uVar13 = 0;
        }
        else {
          iVar4 = 7;
          do {
            auVar17._0_4_ = *pfVar11 + *pfVar9;
            auVar17._4_4_ = pfVar11[1] + pfVar9[1];
            auVar17._8_4_ = pfVar11[2] + pfVar9[2];
            auVar17._12_4_ = pfVar11[3] + pfVar9[3];
            auVar17._16_4_ = pfVar11[4] + pfVar9[4];
            auVar17._20_4_ = pfVar11[5] + pfVar9[5];
            auVar17._24_4_ = pfVar11[6] + pfVar9[6];
            auVar17._28_4_ = pfVar11[7] + pfVar9[7];
            *pauVar3 = auVar17;
            pfVar9 = pfVar9 + 8;
            pfVar11 = pfVar11 + 8;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 8;
            uVar13 = uVar7 & 0xfffffff8;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar13 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar15._0_4_ = *pfVar11 + *pfVar9;
          auVar15._4_4_ = pfVar11[1] + pfVar9[1];
          auVar15._8_4_ = pfVar11[2] + pfVar9[2];
          auVar15._12_4_ = pfVar11[3] + pfVar9[3];
          *(undefined1 (*) [16])*pauVar3 = auVar15;
          pfVar9 = pfVar9 + 4;
          pfVar11 = pfVar11 + 4;
          pauVar3 = (undefined1 (*) [32])((long)*pauVar3 + 0x10);
          uVar5 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar7 - uVar13 != 0 && (int)uVar13 <= (int)uVar7) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar3 + lVar14 * 4) = pfVar11[lVar14] + pfVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (uVar7 - uVar13 != (int)lVar14);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 1:
    pMVar6 = b;
    b = a;
    goto LAB_003d2c21;
  case 2:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pfVar9 = (float *)(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pfVar11 = (float *)(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [32])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 8) {
          uVar13 = 0;
        }
        else {
          iVar4 = 7;
          do {
            auVar1._4_4_ = pfVar11[1] * pfVar9[1];
            auVar1._0_4_ = *pfVar11 * *pfVar9;
            auVar1._8_4_ = pfVar11[2] * pfVar9[2];
            auVar1._12_4_ = pfVar11[3] * pfVar9[3];
            auVar1._16_4_ = pfVar11[4] * pfVar9[4];
            auVar1._20_4_ = pfVar11[5] * pfVar9[5];
            auVar1._24_4_ = pfVar11[6] * pfVar9[6];
            auVar1._28_4_ = pfVar11[7];
            *pauVar3 = auVar1;
            pfVar9 = pfVar9 + 8;
            pfVar11 = pfVar11 + 8;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 8;
            uVar13 = uVar7 & 0xfffffff8;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar13 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar16._0_4_ = *pfVar11 * *pfVar9;
          auVar16._4_4_ = pfVar11[1] * pfVar9[1];
          auVar16._8_4_ = pfVar11[2] * pfVar9[2];
          auVar16._12_4_ = pfVar11[3] * pfVar9[3];
          *(undefined1 (*) [16])*pauVar3 = auVar16;
          pfVar9 = pfVar9 + 4;
          pfVar11 = pfVar11 + 4;
          pauVar3 = (undefined1 (*) [32])(*pauVar3 + 0x10);
          uVar5 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar7 - uVar13 != 0 && (int)uVar13 <= (int)uVar7) {
          lVar14 = 0;
          do {
            *(float *)(*pauVar3 + lVar14 * 4) = pfVar11[lVar14] * pfVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (uVar7 - uVar13 != (int)lVar14);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 3:
    pMVar6 = b;
    b = a;
    goto LAB_003d2d46;
  case 4:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [32])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar12 = (undefined1 (*) [32])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [32])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 8) {
          uVar13 = 0;
        }
        else {
          iVar4 = 7;
          do {
            auVar1 = vmaxps_avx(*pauVar10,*pauVar12);
            *pauVar3 = auVar1;
            pauVar10 = pauVar10 + 1;
            pauVar12 = pauVar12 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 8;
            uVar13 = uVar7 & 0xfffffff8;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar13 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar16 = vmaxps_avx(*(undefined1 (*) [16])*pauVar10,*(undefined1 (*) [16])*pauVar12);
          *(undefined1 (*) [16])*pauVar3 = auVar16;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
          pauVar3 = (undefined1 (*) [32])(*pauVar3 + 0x10);
          uVar5 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar7 - uVar13 != 0 && (int)uVar13 <= (int)uVar7) {
          lVar14 = 0;
          do {
            auVar16 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar12 + lVar14 * 4)),
                                 ZEXT416(*(uint *)(*pauVar10 + lVar14 * 4)));
            *(int *)(*pauVar3 + lVar14 * 4) = auVar16._0_4_;
            lVar14 = lVar14 + 1;
          } while (uVar7 - uVar13 != (int)lVar14);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 5:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [32])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar12 = (undefined1 (*) [32])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [32])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 8) {
          uVar13 = 0;
        }
        else {
          iVar4 = 7;
          do {
            auVar1 = vminps_avx(*pauVar10,*pauVar12);
            *pauVar3 = auVar1;
            pauVar10 = pauVar10 + 1;
            pauVar12 = pauVar12 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 8;
            uVar13 = uVar7 & 0xfffffff8;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar13 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar16 = vminps_avx(*(undefined1 (*) [16])*pauVar10,*(undefined1 (*) [16])*pauVar12);
          *(undefined1 (*) [16])*pauVar3 = auVar16;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
          pauVar3 = (undefined1 (*) [32])(*pauVar3 + 0x10);
          uVar5 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar7 - uVar13 != 0 && (int)uVar13 <= (int)uVar7) {
          lVar14 = 0;
          do {
            auVar16 = vminss_avx(ZEXT416(*(uint *)(*pauVar12 + lVar14 * 4)),
                                 ZEXT416(*(uint *)(*pauVar10 + lVar14 * 4)));
            *(int *)(*pauVar3 + lVar14 * 4) = auVar16._0_4_;
            lVar14 = lVar14 + 1;
          } while (uVar7 - uVar13 != (int)lVar14);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 6:
    pMVar6 = b;
    b = a;
    goto LAB_003d2d27;
  case 7:
    pMVar6 = a;
LAB_003d2c21:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>(b,pMVar6,c,opt_00)
    ;
    return iVar2;
  case 8:
    pMVar6 = a;
LAB_003d2d46:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_div>(b,pMVar6,c,opt_00)
    ;
    return iVar2;
  case 9:
    pMVar6 = a;
LAB_003d2d27:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>(b,pMVar6,c,opt_00)
    ;
    return iVar2;
  case 10:
    pMVar6 = b;
    b = a;
    goto LAB_003d2d35;
  case 0xb:
    pMVar6 = a;
LAB_003d2d35:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
                      (b,pMVar6,c,opt_00);
    return iVar2;
  }
switchD_003d291d_default:
  return (int)in_RAX;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    using namespace BinaryOp_x86_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_no_broadcast<binary_op_add>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_no_broadcast<binary_op_sub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_no_broadcast<binary_op_mul>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_no_broadcast<binary_op_div>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_no_broadcast<binary_op_max>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_no_broadcast<binary_op_min>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_no_broadcast<binary_op_pow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_no_broadcast<binary_op_sub>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_no_broadcast<binary_op_div>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_no_broadcast<binary_op_pow>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_no_broadcast<binary_op_atan2>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_no_broadcast<binary_op_atan2>(b, a, c, opt);

    // should never reach here
    return 0;
}